

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_32UL> *param_5)

{
  double *value;
  Array<char> local_50;
  CappedArray<char,_32UL> local_38;
  
  operator*<double>(&local_50);
  toCharSequence<double&>(&local_38,(kj *)(param_2 + 0x10),value);
  concat<kj::String,kj::StringPtr&,kj::CappedArray<char,32ul>>
            (__return_storage_ptr__,(_ *)&local_50,(String *)(param_2 + 0x18),(StringPtr *)&local_38
             ,param_5);
  Array<char>::~Array(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}